

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpStructMatrix.cpp
# Opt level: O2

TPZMatrix<double> * __thiscall
TPZSpStructMatrix<double,_TPZStructMatrixOT<double>_>::Create
          (TPZSpStructMatrix<double,_TPZStructMatrixOT<double>_> *this)

{
  long lVar1;
  TPZMatrix<double> *pTVar2;
  TPZVec<long> elgraphindex;
  TPZStack<long,_10> elgraph;
  
  TPZCompMesh::NEquations((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh);
  lVar1 = (**(code **)(*(long *)(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh +
                      0x98))();
  if (lVar1 != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n"
                   );
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZSpStructMatrix.cpp"
               ,0x25);
  }
  TPZStack<long,_10>::TPZStack(&elgraph);
  elgraphindex._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  elgraphindex.fStore = (long *)0x0;
  elgraphindex.fNElements = 0;
  elgraphindex.fNAlloc = 0;
  TPZCompMesh::ComputeElGraph
            ((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh,&elgraph,
             &elgraphindex);
  pTVar2 = (TPZMatrix<double> *)
           (**(code **)(*(long *)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix +
                       0x60))(this,&elgraph,&elgraphindex);
  TPZVec<long>::~TPZVec(&elgraphindex);
  TPZManVector<long,_10>::~TPZManVector(&elgraph.super_TPZManVector<long,_10>);
  return pTVar2;
}

Assistant:

TPZMatrix<TVar> * TPZSpStructMatrix<TVar,TPar>::Create(){
    int64_t neq = this->fMesh->NEquations();
    if(this->fMesh->FatherMesh()) {
		PZError << "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n";
		DebugStop();
    }
	
    /**
     *Longhin implementation
	 */
    TPZStack<int64_t> elgraph;
    TPZVec<int64_t> elgraphindex;
    //    int nnodes = 0;
    this->fMesh->ComputeElGraph(elgraph,elgraphindex);
    TPZMatrix<TVar> * mat = SetupMatrixData(elgraph,elgraphindex);
    return mat;
}